

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsVarSerializer(ReallocateBufferMemoryFunc reallocateBufferMemory,
               WriteHostObjectFunc writeHostObject,void *callbackState,
               JsVarSerializerHandle *serializerHandle)

{
  anon_class_32_4_6ed1c686 fn;
  JsVarSerializerHandle *ppvStack_30;
  JsErrorCode errorCode;
  JsVarSerializerHandle *serializerHandle_local;
  void *callbackState_local;
  WriteHostObjectFunc writeHostObject_local;
  ReallocateBufferMemoryFunc reallocateBufferMemory_local;
  
  if (reallocateBufferMemory == (ReallocateBufferMemoryFunc)0x0) {
    reallocateBufferMemory_local._4_4_ = JsErrorNullArgument;
  }
  else if (writeHostObject == (WriteHostObjectFunc)0x0) {
    reallocateBufferMemory_local._4_4_ = JsErrorNullArgument;
  }
  else if (serializerHandle == (JsVarSerializerHandle *)0x0) {
    reallocateBufferMemory_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.writeHostObject = (WriteHostObjectFunc *)&callbackState_local;
    fn.reallocateBufferMemory = (ReallocateBufferMemoryFunc *)&writeHostObject_local;
    fn.callbackState = &serializerHandle_local;
    fn.serializerHandle = &stack0xffffffffffffffd0;
    ppvStack_30 = serializerHandle;
    serializerHandle_local = (JsVarSerializerHandle *)callbackState;
    callbackState_local = writeHostObject;
    writeHostObject_local = (WriteHostObjectFunc)reallocateBufferMemory;
    reallocateBufferMemory_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarSerializer::__0>(fn,false,false);
  }
  return reallocateBufferMemory_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarSerializer(
    _In_ ReallocateBufferMemoryFunc reallocateBufferMemory,
    _In_ WriteHostObjectFunc writeHostObject,
    _In_opt_ void * callbackState,
    _Out_ JsVarSerializerHandle *serializerHandle)
{
    PARAM_NOT_NULL(reallocateBufferMemory);
    PARAM_NOT_NULL(writeHostObject);
    PARAM_NOT_NULL(serializerHandle);
    JsErrorCode errorCode = ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        ChakraCoreStreamWriter *writer = HeapNew(ChakraCoreStreamWriter, reallocateBufferMemory, writeHostObject, callbackState);
        writer->SetSerializer(HeapNew(Js::SCACore::Serializer, scriptContext, writer));
        *serializerHandle = writer;
        return JsNoError;
    });

    return errorCode;

}